

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void amrex::BARef::Initialize(void)

{
  if ((initialized & 1) == 0) {
    initialized = 1;
  }
  ExecOnFinalize((PTR_TO_VOID_FUNC)0xfb35bd);
  return;
}

Assistant:

void
BARef::Initialize ()
{
    if (!initialized) {
        initialized = true;
#ifdef AMREX_MEM_PROFILING
        MemProfiler::add("BoxArray", std::function<MemProfiler::MemInfo()>
             ([] () -> MemProfiler::MemInfo {
                 return {total_box_bytes, total_box_bytes_hwm};
             }));
        MemProfiler::add("BoxArrayHash", std::function<MemProfiler::MemInfo()>
             ([] () -> MemProfiler::MemInfo {
                 return {total_hash_bytes, total_hash_bytes_hwm};
             }));
        MemProfiler::add("BoxArray Innard", std::function<MemProfiler::NBuildsInfo()>
             ([] () -> MemProfiler::NBuildsInfo {
                 return {numboxarrays, numboxarrays_hwm};
             }));
#endif
    }

    amrex::ExecOnFinalize(BARef::Finalize);
}